

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

void Service_OpenSecureChannel
               (UA_Server *server,UA_Connection *connection,UA_OpenSecureChannelRequest *request,
               UA_OpenSecureChannelResponse *response)

{
  UA_StatusCode UVar1;
  
  if (request->requestType == UA_SECURITYTOKENREQUESTTYPE_ISSUE) {
    UVar1 = UA_SecureChannelManager_open(&server->secureChannelManager,connection,request,response);
    (response->responseHeader).serviceResult = UVar1;
    if (UVar1 == 0) {
      UA_LOG_INFO((server->config).logger,UA_LOGCATEGORY_SECURECHANNEL,
                  "Connection %i | SecureChannel %i | OpenSecureChannel: Opened SecureChannel",
                  (ulong)(uint)connection->sockfd,(ulong)(response->securityToken).channelId);
      return;
    }
  }
  else {
    UVar1 = UA_SecureChannelManager_renew(&server->secureChannelManager,connection,request,response)
    ;
    (response->responseHeader).serviceResult = UVar1;
  }
  return;
}

Assistant:

void Service_OpenSecureChannel(UA_Server *server, UA_Connection *connection,
                               const UA_OpenSecureChannelRequest *request,
                               UA_OpenSecureChannelResponse *response) {
    // todo: if(request->clientProtocolVersion != protocolVersion)
    if(request->requestType == UA_SECURITYTOKENREQUESTTYPE_ISSUE) {
        response->responseHeader.serviceResult =
            UA_SecureChannelManager_open(&server->secureChannelManager, connection, request, response);

        if(response->responseHeader.serviceResult == UA_STATUSCODE_GOOD) {
            UA_LOG_INFO(server->config.logger, UA_LOGCATEGORY_SECURECHANNEL,
                         "Connection %i | SecureChannel %i | OpenSecureChannel: Opened SecureChannel",
                         connection->sockfd, response->securityToken.channelId);
        } else {
            UA_LOG_DEBUG(server->config.logger, UA_LOGCATEGORY_SECURECHANNEL,
                         "Connection %i | OpenSecureChannel: Opening a SecureChannel failed",
                         connection->sockfd);
        }
    } else {
        response->responseHeader.serviceResult =
            UA_SecureChannelManager_renew(&server->secureChannelManager, connection, request, response);

        if(response->responseHeader.serviceResult == UA_STATUSCODE_GOOD) {
            UA_LOG_DEBUG(server->config.logger, UA_LOGCATEGORY_SECURECHANNEL,
                         "Connection %i | SecureChannel %i | OpenSecureChannel: SecureChannel renewed",
                         connection->sockfd, response->securityToken.channelId);
        } else {
            UA_LOG_DEBUG(server->config.logger, UA_LOGCATEGORY_SECURECHANNEL,
                         "Connection %i | OpenSecureChannel: Renewing SecureChannel failed",
                         connection->sockfd);
        }
    }
}